

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O3

Block * __thiscall soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,Block *b)

{
  pointer ppVar1;
  Statement *pSVar2;
  pool_ref<soul::AST::Statement> *s;
  pointer ppVar3;
  
  ppVar1 = (b->statements).
           super__Vector_base<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar3 = (b->statements).
                super__Vector_base<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    pSVar2 = visitObject(this,ppVar3->object);
    if (ppVar3->object != pSVar2) {
      this->itemsReplaced = this->itemsReplaced + 1;
      ppVar3->object = pSVar2;
    }
  }
  return b;
}

Assistant:

virtual AST::Block& visit (AST::Block& b)
    {
        for (auto& s : b.statements)
            replaceStatement (s);

        return b;
    }